

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseFunction(Parser *this,string *name,Value *e)

{
  bool bVar1;
  char *pcVar2;
  undefined8 in_RCX;
  string local_2c0;
  byte local_29a;
  allocator<char> local_299;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  allocator<char> local_271;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  byte local_1aa;
  byte local_1a9;
  bool func_match;
  double dStack_1a8;
  double y;
  double x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string functionname;
  undefined1 local_38 [8];
  ParseDepthGuard depth_guard;
  Value *e_local;
  string *name_local;
  Parser *this_local;
  CheckedError *ce;
  
  depth_guard._8_8_ = in_RCX;
  ParseDepthGuard::ParseDepthGuard((ParseDepthGuard *)local_38,(Parser *)name);
  ParseDepthGuard::Check((ParseDepthGuard *)this);
  functionname.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
  functionname.field_2._9_3_ = 0;
  if (!(bool)functionname.field_2._M_local_buf[8]) {
    CheckedError::~CheckedError((CheckedError *)this);
  }
  if (functionname.field_2._8_4_ == 0) {
    std::__cxx11::string::string((string *)local_70,(string *)&name[1]._M_string_length);
    bVar1 = IsFloat(*(BaseType *)depth_guard._8_8_);
    if (bVar1) {
      x._5_1_ = 0;
      Next(this);
      functionname.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
      if ((bool)functionname.field_2._M_local_buf[8]) {
        x._5_1_ = 1;
      }
      functionname.field_2._9_3_ = 0;
      if ((x._5_1_ & 1) == 0) {
        CheckedError::~CheckedError((CheckedError *)this);
      }
      if (functionname.field_2._8_4_ == 0) {
        x._4_1_ = 0;
        Expect(this,(int)name);
        functionname.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
        if ((bool)functionname.field_2._M_local_buf[8]) {
          x._4_1_ = 1;
        }
        functionname.field_2._9_3_ = 0;
        if ((x._4_1_ & 1) == 0) {
          CheckedError::~CheckedError((CheckedError *)this);
        }
        if (functionname.field_2._8_4_ == 0) {
          x._3_1_ = 0;
          ParseSingleValue(this,name,e,depth_guard.caller_depth_._0_1_);
          functionname.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
          if ((bool)functionname.field_2._M_local_buf[8]) {
            x._3_1_ = 1;
          }
          functionname.field_2._9_3_ = 0;
          if ((x._3_1_ & 1) == 0) {
            CheckedError::~CheckedError((CheckedError *)this);
          }
          if (functionname.field_2._8_4_ == 0) {
            x._2_1_ = 0;
            Expect(this,(int)name);
            functionname.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
            if ((bool)functionname.field_2._M_local_buf[8]) {
              x._2_1_ = 1;
            }
            functionname.field_2._9_3_ = 0;
            if ((x._2_1_ & 1) == 0) {
              CheckedError::~CheckedError((CheckedError *)this);
            }
            if (functionname.field_2._8_4_ == 0) {
              dStack_1a8 = 0.0;
              local_1a9 = 0;
              pcVar2 = (char *)std::__cxx11::string::c_str();
              anon_unknown_0::atot<double>((anon_unknown_0 *)this,pcVar2,(Parser *)name,&y);
              functionname.field_2._M_local_buf[8] = CheckedError::Check((CheckedError *)this);
              if ((bool)functionname.field_2._M_local_buf[8]) {
                local_1a9 = 1;
              }
              functionname.field_2._9_3_ = 0;
              if ((local_1a9 & 1) == 0) {
                CheckedError::~CheckedError((CheckedError *)this);
              }
              if (functionname.field_2._8_4_ == 0) {
                local_1aa = 0;
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_70,"deg");
                if (bVar1) {
                  dStack_1a8 = (y / 3.141592653589793) * 180.0;
                  local_1aa = 1;
                }
                if (((local_1aa & 1) == 0) &&
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_70,"rad"), bVar1)) {
                  dStack_1a8 = (y * 3.141592653589793) / 180.0;
                  local_1aa = 1;
                }
                if (((local_1aa & 1) == 0) &&
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_70,"sin"), bVar1)) {
                  dStack_1a8 = sin(y);
                  local_1aa = 1;
                }
                if (((local_1aa & 1) == 0) &&
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_70,"cos"), bVar1)) {
                  dStack_1a8 = cos(y);
                  local_1aa = 1;
                }
                if (((local_1aa & 1) == 0) &&
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_70,"tan"), bVar1)) {
                  dStack_1a8 = tan(y);
                  local_1aa = 1;
                }
                if (((local_1aa & 1) == 0) &&
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_70,"asin"), bVar1)) {
                  dStack_1a8 = asin(y);
                  local_1aa = 1;
                }
                if (((local_1aa & 1) == 0) &&
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_70,"acos"), bVar1)) {
                  dStack_1a8 = acos(y);
                  local_1aa = 1;
                }
                if (((local_1aa & 1) == 0) &&
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_70,"atan"), bVar1)) {
                  dStack_1a8 = atan(y);
                  local_1aa = 1;
                }
                if ((local_1aa & 1) == 1) {
                  NumToString<double>(&local_2c0,dStack_1a8);
                  std::__cxx11::string::operator=
                            ((string *)(depth_guard._8_8_ + 0x20),(string *)&local_2c0);
                  std::__cxx11::string::~string((string *)&local_2c0);
                  anon_unknown_0::NoError();
                  functionname.field_2._8_4_ = 1;
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_270,"Unknown conversion function: ",&local_271);
                  std::operator+(&local_250,&local_270,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_70);
                  std::operator+(&local_230,&local_250,", field name: ");
                  local_29a = 0;
                  if (e == (Value *)0x0) {
                    std::allocator<char>::allocator();
                    local_29a = 1;
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_298,"",&local_299);
                  }
                  else {
                    std::__cxx11::string::string((string *)&local_298,(string *)e);
                  }
                  std::operator+(&local_210,&local_230,&local_298);
                  std::operator+(&local_1f0,&local_210,", value: ");
                  std::operator+(&local_1d0,&local_1f0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(depth_guard._8_8_ + 0x20));
                  Error(this,name);
                  std::__cxx11::string::~string((string *)&local_1d0);
                  std::__cxx11::string::~string((string *)&local_1f0);
                  std::__cxx11::string::~string((string *)&local_210);
                  std::__cxx11::string::~string((string *)&local_298);
                  if ((local_29a & 1) != 0) {
                    std::allocator<char>::~allocator(&local_299);
                  }
                  std::__cxx11::string::~string((string *)&local_230);
                  std::__cxx11::string::~string((string *)&local_250);
                  std::__cxx11::string::~string((string *)&local_270);
                  std::allocator<char>::~allocator(&local_271);
                  functionname.field_2._8_4_ = 1;
                }
              }
            }
          }
        }
      }
    }
    else {
      std::operator+(&local_170,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     ": type of argument mismatch, expecting: ");
      pcVar2 = TypeName(BASE_TYPE_DOUBLE);
      std::operator+(&local_150,&local_170,pcVar2);
      std::operator+(&local_130,&local_150,", found: ");
      pcVar2 = TypeName(*(BaseType *)depth_guard._8_8_);
      std::operator+(&local_110,&local_130,pcVar2);
      std::operator+(&local_f0,&local_110,", name: ");
      x._6_1_ = 0;
      if (e == (Value *)0x0) {
        std::allocator<char>::allocator();
        x._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"",(allocator<char> *)((long)&x + 7));
      }
      else {
        std::__cxx11::string::string((string *)&local_190,(string *)e);
      }
      std::operator+(&local_d0,&local_f0,&local_190);
      std::operator+(&local_b0,&local_d0,", value: ");
      std::operator+(&local_90,&local_b0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (depth_guard._8_8_ + 0x20));
      Error(this,name);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_190);
      if ((x._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&x + 7));
      }
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_170);
      functionname.field_2._8_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_70);
  }
  ParseDepthGuard::~ParseDepthGuard((ParseDepthGuard *)local_38);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseFunction(const std::string *name, Value &e) {
  ParseDepthGuard depth_guard(this);
  ECHECK(depth_guard.Check());

  // Copy name, attribute will be changed on NEXT().
  const auto functionname = attribute_;
  if (!IsFloat(e.type.base_type)) {
    return Error(functionname + ": type of argument mismatch, expecting: " +
                 TypeName(BASE_TYPE_DOUBLE) +
                 ", found: " + TypeName(e.type.base_type) +
                 ", name: " + (name ? *name : "") + ", value: " + e.constant);
  }
  NEXT();
  EXPECT('(');
  ECHECK(ParseSingleValue(name, e, false));
  EXPECT(')');
  // calculate with double precision
  double x, y = 0.0;
  ECHECK(atot(e.constant.c_str(), *this, &x));
  // clang-format off
  auto func_match = false;
  #define FLATBUFFERS_FN_DOUBLE(name, op) \
    if (!func_match && functionname == name) { y = op; func_match = true; }
  FLATBUFFERS_FN_DOUBLE("deg", x / kPi * 180);
  FLATBUFFERS_FN_DOUBLE("rad", x * kPi / 180);
  FLATBUFFERS_FN_DOUBLE("sin", sin(x));
  FLATBUFFERS_FN_DOUBLE("cos", cos(x));
  FLATBUFFERS_FN_DOUBLE("tan", tan(x));
  FLATBUFFERS_FN_DOUBLE("asin", asin(x));
  FLATBUFFERS_FN_DOUBLE("acos", acos(x));
  FLATBUFFERS_FN_DOUBLE("atan", atan(x));
  // TODO(wvo): add more useful conversion functions here.
  #undef FLATBUFFERS_FN_DOUBLE
  // clang-format on
  if (true != func_match) {
    return Error(std::string("Unknown conversion function: ") + functionname +
                 ", field name: " + (name ? *name : "") +
                 ", value: " + e.constant);
  }
  e.constant = NumToString(y);
  return NoError();
}